

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::remove_underscore(string *__return_storage_ptr__,string *str)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined8 local_48;
  char local_39;
  char *local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20;
  string *local_18;
  string *str_local;
  
  local_18 = str;
  str_local = __return_storage_ptr__;
  local_30._M_current = (char *)::std::begin<std::__cxx11::string>(str);
  local_38 = (char *)::std::end<std::__cxx11::string>(str);
  local_39 = '_';
  local_28 = ::std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (local_30,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_38,&local_39);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_20,&local_28);
  local_50._M_current = (char *)::std::end<std::__cxx11::string>(str);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_48,&local_50);
  ::std::__cxx11::string::erase(str,local_20,local_48);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

inline std::string remove_underscore(std::string str) {
    str.erase(std::remove(std::begin(str), std::end(str), '_'), std::end(str));
    return str;
}